

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TailVerifying.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::record::TailVerification<2,njoy::ENDFtk::record::Tail>::
TailVerification<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>const&,long&>
          (TailVerification<2,njoy::ENDFtk::record::Tail> *this,int expectedValue,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *args,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *args_1,long *args_2)

{
  undefined4 *puVar1;
  _Alloc_hider in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  Tail::Tail<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((Tail *)this,args,args_1,args_2);
  if (*(int *)(this + 8) == expectedValue) {
    return;
  }
  std::__cxx11::string::string((string *)&local_78,(string *)helper::name<2>);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff68,(string *)helper::symbol<2>);
  tools::Log::error<char_const*,std::__cxx11::string,std::__cxx11::string>
            ("The record {} number ({}) is inconsistent with expectation.",&local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff68);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&local_38,(string *)helper::name<2>);
  tools::Log::info<char_const*,std::__cxx11::string,int>
            ("The read {} number is: {}",&local_38,*(int *)(this + 8));
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_58,(string *)helper::name<2>);
  tools::Log::info<char_const*,std::__cxx11::string,int>
            ("The expected {} number is: {}",&local_58,expectedValue);
  std::__cxx11::string::~string((string *)&local_58);
  tools::Log::info<char_const*>(in_stack_ffffffffffffff68._M_p);
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 8;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

TailVerification( int expectedValue, Args&&... args ) :
      Tail( std::forward< Args >( args )... ) {
      if( this->fields[ position ] != expectedValue ){
        Log::error( "The record {} number ({}) is inconsistent with expectation.",
                    helper::name< position >, helper::symbol< position > );
        Log::info( "The read {} number is: {}",
                   helper::name< position >, this->fields[ position ] );
        Log::info( "The expected {} number is: {}",
                   helper::name< position >, expectedValue );
        Log::info( "Error encountered while verifying record tail values" );

        throw (position + 6);
      }
    }